

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

int If_ManImproveNodeFaninCost(If_Man_t *p,If_Obj_t *pObj)

{
  int iVar1;
  If_Obj_t *pIVar2;
  int local_1c;
  int Counter;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  local_1c = 0;
  iVar1 = If_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    if (pObj->nRefs == 0) {
      local_1c = -1;
    }
    pIVar2 = If_ObjFanin0(pObj);
    if ((*(uint *)pIVar2 >> 8 & 1) == 0) {
      pIVar2 = If_ObjFanin0(pObj);
      if (pIVar2->nRefs == 0) {
        local_1c = local_1c + 1;
      }
    }
    pIVar2 = If_ObjFanin1(pObj);
    if ((*(uint *)pIVar2 >> 8 & 1) == 0) {
      pIVar2 = If_ObjFanin1(pObj);
      if (pIVar2->nRefs == 0) {
        local_1c = local_1c + 1;
      }
    }
    return local_1c;
  }
  __assert_fail("If_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifReduce.c"
                ,0x121,"int If_ManImproveNodeFaninCost(If_Man_t *, If_Obj_t *)");
}

Assistant:

int If_ManImproveNodeFaninCost( If_Man_t * p, If_Obj_t * pObj )
{
    int Counter = 0;
    assert( If_ObjIsAnd(pObj) );
    // check if the node has external refs
    if ( pObj->nRefs == 0 )
        Counter--;
    // increment the number of fanins without external refs
    if ( !If_ObjFanin0(pObj)->fMark && If_ObjFanin0(pObj)->nRefs == 0 )
        Counter++;
    // increment the number of fanins without external refs
    if ( !If_ObjFanin1(pObj)->fMark && If_ObjFanin1(pObj)->nRefs == 0 )
        Counter++;
    return Counter;
}